

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::MakeUnique(Discreet3DSImporter *this,Mesh *sMesh)

{
  uint uVar1;
  pointer pFVar2;
  pointer paVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vNew2;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vNew;
  _Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_58;
  _Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_38;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_38,
             ((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                    super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                    super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * 3,(allocator_type *)&local_58);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((sMesh->mTexCoords).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (sMesh->mTexCoords).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_58,
               ((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                      super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                      super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * 3);
  }
  uVar5 = 0;
  uVar6 = 0;
  while( true ) {
    uVar7 = (ulong)uVar5;
    pFVar2 = (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
             super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                      super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 4) <= uVar7)
    break;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      uVar1 = pFVar2[uVar7].super_FaceWithSmoothingGroup.mIndices[lVar8];
      paVar3 = (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (ulong)uVar6 + lVar8 & 0xffffffff;
      local_38._M_impl.super__Vector_impl_data._M_start[uVar9].z =
           *(float *)((long)(paVar3 + uVar1) + 8);
      paVar3 = paVar3 + uVar1;
      fVar4 = paVar3->y;
      local_38._M_impl.super__Vector_impl_data._M_start[uVar9].x = paVar3->x;
      local_38._M_impl.super__Vector_impl_data._M_start[uVar9].y = fVar4;
      paVar3 = (sMesh->mTexCoords).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((sMesh->mTexCoords).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish != paVar3) {
        uVar1 = pFVar2[uVar7].super_FaceWithSmoothingGroup.mIndices[lVar8];
        local_58._M_impl.super__Vector_impl_data._M_start[uVar9].z = paVar3[uVar1].z;
        fVar4 = paVar3[uVar1].y;
        local_58._M_impl.super__Vector_impl_data._M_start[uVar9].x = paVar3[uVar1].x;
        local_58._M_impl.super__Vector_impl_data._M_start[uVar9].y = fVar4;
      }
      pFVar2[uVar7].super_FaceWithSmoothingGroup.mIndices[lVar8] = (uint32_t)((ulong)uVar6 + lVar8);
    }
    uVar5 = uVar5 + 1;
    uVar6 = uVar6 + 3;
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)sMesh,
             (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_38);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            (&sMesh->mTexCoords,
             (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_58);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&local_58);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&local_38);
  return;
}

Assistant:

void Discreet3DSImporter::MakeUnique(D3DS::Mesh& sMesh)
{
    // TODO: really necessary? I don't think. Just a waste of memory and time
    // to do it now in a separate buffer.

    // Allocate output storage
    std::vector<aiVector3D> vNew  (sMesh.mFaces.size() * 3);
    std::vector<aiVector3D> vNew2;
    if (sMesh.mTexCoords.size())
        vNew2.resize(sMesh.mFaces.size() * 3);

    for (unsigned int i = 0, base = 0; i < sMesh.mFaces.size();++i)
    {
        D3DS::Face& face = sMesh.mFaces[i];

        // Positions
        for (unsigned int a = 0; a < 3;++a,++base)
        {
            vNew[base] = sMesh.mPositions[face.mIndices[a]];
            if (sMesh.mTexCoords.size())
                vNew2[base] = sMesh.mTexCoords[face.mIndices[a]];

            face.mIndices[a] = base;
        }
    }
    sMesh.mPositions = vNew;
    sMesh.mTexCoords = vNew2;
}